

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O3

bool __thiscall
cmGlobalGhsMultiGenerator::TargetCompare::operator()
          (TargetCompare *this,cmGeneratorTarget *l,cmGeneratorTarget *r)

{
  size_t sVar1;
  int iVar2;
  byte extraout_var;
  string *psVar3;
  
  psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(r);
  sVar1 = psVar3->_M_string_length;
  if ((sVar1 == (this->First)._M_string_length) &&
     ((sVar1 == 0 ||
      (iVar2 = bcmp((psVar3->_M_dataplus)._M_p,(this->First)._M_dataplus._M_p,sVar1), iVar2 == 0))))
  {
    return false;
  }
  psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(l);
  sVar1 = psVar3->_M_string_length;
  if (sVar1 == (this->First)._M_string_length) {
    if (sVar1 == 0) {
      return true;
    }
    iVar2 = bcmp((psVar3->_M_dataplus)._M_p,(this->First)._M_dataplus._M_p,sVar1);
    if (iVar2 == 0) {
      return true;
    }
  }
  psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(l);
  cmGeneratorTarget::GetName_abi_cxx11_(r);
  std::__cxx11::string::compare((string *)psVar3);
  return (bool)(extraout_var >> 7);
}

Assistant:

bool cmGlobalGhsMultiGenerator::TargetCompare::operator()(
  cmGeneratorTarget const* l, cmGeneratorTarget const* r) const
{
  // Make sure a given named target is ordered first,
  // e.g. to set ALL_BUILD as the default active project.
  // When the empty string is named this is a no-op.
  if (r->GetName() == this->First) {
    return false;
  }
  if (l->GetName() == this->First) {
    return true;
  }
  return l->GetName() < r->GetName();
}